

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.h
# Opt level: O0

void __thiscall Table::Table(Table *this)

{
  Cell local_19;
  Cell local_18;
  Cell local_17;
  Cell local_16;
  Cell local_15;
  Cell local_14;
  Cell local_13;
  Cell local_12;
  Cell local_11;
  Table *local_10;
  Table *this_local;
  
  this->current_row = 1;
  this->current_col = 1;
  local_10 = this;
  Cell::Cell(&local_11,'1');
  this->table[0][0].number = local_11.number;
  Cell::Cell(&local_12,'3');
  this->table[0][1].number = local_12.number;
  Cell::Cell(&local_13,'6');
  this->table[0][2].number = local_13.number;
  Cell::Cell(&local_14,'4');
  this->table[1][0].number = local_14.number;
  Cell::Cell(&local_15,' ');
  this->table[1][1].number = local_15.number;
  Cell::Cell(&local_16,'2');
  this->table[1][2].number = local_16.number;
  Cell::Cell(&local_17,'7');
  this->table[2][0].number = local_17.number;
  Cell::Cell(&local_18,'5');
  this->table[2][1].number = local_18.number;
  Cell::Cell(&local_19,'8');
  this->table[2][2].number = local_19.number;
  return;
}

Assistant:

Table() {
        table[0][0] = Cell('1');
        table[0][1] = Cell('3');
        table[0][2] = Cell('6');
        table[1][0] = Cell('4');
        table[1][1] = Cell(' ');
        table[1][2] = Cell('2');
        table[2][0] = Cell('7');
        table[2][1] = Cell('5');
        table[2][2] = Cell('8');
    }